

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

void proc_reloc(void)

{
  t_proc **pptVar1;
  int local_28;
  int tmp;
  int addr;
  int i;
  t_proc *group;
  t_symbol *local;
  t_symbol *sym;
  
  if (proc_nb != 0) {
    bank = max_bank + 1;
    local_28 = 0;
    for (proc_ptr = proc_first; proc_ptr != (t_proc *)0x0; proc_ptr = proc_ptr->link) {
      if (proc_ptr->group == (t_proc *)0x0) {
        if (0x2000 < local_28 + proc_ptr->size) {
          bank = bank + 1;
          local_28 = 0;
        }
        if (bank_limit < bank) {
          fatal_error("Not enough ROM space for procs!");
          return;
        }
        proc_ptr->bank = bank;
        proc_ptr->org = local_28;
        local_28 = proc_ptr->size + local_28;
      }
      else {
        pptVar1 = &proc_ptr->group;
        proc_ptr->bank = bank;
        proc_ptr->org = ((*pptVar1)->org - (*pptVar1)->base) + proc_ptr->org;
      }
      max_bank = bank;
      proc_ptr->refcnt = 0;
    }
    for (tmp = 0; tmp < 0x100; tmp = tmp + 1) {
      for (local = hash_tbl[tmp]; local != (t_symbol *)0x0; local = local->next) {
        proc_ptr = local->proc;
        if (local->proc != (t_proc *)0x0) {
          local->bank = proc_ptr->bank;
          local->value = (proc_ptr->org - proc_ptr->base) + local->value;
          if (local->local != (t_symbol *)0x0) {
            for (group = (t_proc *)local->local; group != (t_proc *)0x0; group = group->next) {
              proc_ptr = group->group;
              if (group->group != (t_proc *)0x0) {
                group->org = proc_ptr->bank;
                group->bank = (proc_ptr->org - proc_ptr->base) + group->bank;
              }
            }
          }
        }
      }
    }
    lablset("_call_bank",bank_base + max_bank + 1);
    proc_ptr = (t_proc *)0x0;
    proc_nb = 0;
  }
  return;
}

Assistant:

void
proc_reloc(void)
{
	struct t_symbol *sym;
	struct t_symbol *local;
	struct t_proc   *group;
	int i;
	int addr;
	int tmp;

	if (proc_nb == 0)
		return;

	/* init */
	proc_ptr = proc_first;
	bank = max_bank + 1;
	addr = 0;

	/* alloc memory */
	while (proc_ptr) {
		/* proc */
		if (proc_ptr->group == NULL) {
			tmp = addr + proc_ptr->size;
	
			/* bank change */
			if (tmp > 0x2000) {
				bank++;
				addr = 0;
			}
			if (bank > bank_limit) {
				fatal_error("Not enough ROM space for procs!");
				return;
			}

			/* reloc proc */
			proc_ptr->bank = bank;
			proc_ptr->org = addr;
			addr += proc_ptr->size;
		}

		/* group */
		else {
			/* reloc proc */
			group = proc_ptr->group;
			proc_ptr->bank = bank;
			proc_ptr->org += (group->org - group->base);
		}

		/* next */
		max_bank = bank;
		proc_ptr->refcnt = 0;
		proc_ptr = proc_ptr->link;
	}

	/* remap proc symbols */
	for (i = 0; i < 256; i++) {
		sym = hash_tbl[i];

		while (sym) {
			proc_ptr = sym->proc;

			/* remap addr */
			if (sym->proc) {
				sym->bank   =  proc_ptr->bank;
				sym->value += (proc_ptr->org - proc_ptr->base);

				/* local symbols */
				if (sym->local) {
					local = sym->local;
	
					while (local) {
						proc_ptr = local->proc;
			
						/* remap addr */
						if (local->proc) {
							local->bank   =  proc_ptr->bank;
							local->value += (proc_ptr->org - proc_ptr->base);
						}
		
						/* next */
						local = local->next;
					}
				}
			}

			/* next */
			sym = sym->next;
		}
	}

	/* reserve call bank */
	lablset("_call_bank", bank_base + max_bank + 1);

	/* reset */
	proc_ptr = NULL;
	proc_nb = 0;
}